

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.h
# Opt level: O3

void __thiscall xLearn::Model::~Model(Model *this)

{
  pointer pcVar1;
  
  free_model(this);
  pcVar1 = (this->loss_func_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->loss_func_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->score_func_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->score_func_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Model() { free_model(); }